

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void GEO::expansion::delete_expansion_on_heap(expansion *e)

{
  undefined8 uVar1;
  ulong uVar2;
  
  Process::acquire_spinlock(&expansions_lock);
  uVar2 = (ulong)(e->capacity_ + 1);
  if (uVar2 * 8 + 8 < (ulong)(DAT_001b1b20 - ::(anonymous_namespace)::pools_ >> 3)) {
    uVar1 = *(undefined8 *)(::(anonymous_namespace)::pools_ + 0x40 + uVar2 * 0x40);
    e->length_ = (int)uVar1;
    e->capacity_ = (int)((ulong)uVar1 >> 0x20);
    *(expansion **)(::(anonymous_namespace)::pools_ + 0x40 + uVar2 * 0x40) = e;
  }
  else {
    free(e);
  }
  expansions_lock = 0;
  return;
}

Assistant:

void expansion::delete_expansion_on_heap(expansion* e) {
	Process::acquire_spinlock(expansions_lock);	
        pools_.free(e, expansion::bytes(e->capacity()));
	Process::release_spinlock(expansions_lock);	
    }